

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O1

tommy_tree_node * tommy_tree_balance(tommy_tree_node *root)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  tommy_tree_node *ptVar3;
  tommy_tree_node *ptVar4;
  tommy_key_t tVar5;
  tommy_key_t tVar6;
  tommy_tree_node *prev;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    while( true ) {
      ptVar4 = root->prev;
      tVar6 = 0;
      tVar5 = 0;
      if (ptVar4 != (tommy_tree_node *)0x0) {
        tVar5 = ptVar4->key;
      }
      ptVar3 = root->next;
      if (ptVar3 != (tommy_tree_node *)0x0) {
        tVar6 = ptVar3->key;
      }
      if (-2 < (int)(tVar5 - tVar6)) break;
      ptVar4 = ptVar3->prev;
      tVar6 = 0;
      tVar5 = 0;
      if (ptVar4 != (tommy_tree_node *)0x0) {
        tVar5 = ptVar4->key;
      }
      if (ptVar3->next != (tommy_node_struct *)0x0) {
        tVar6 = ptVar3->next->key;
      }
      if ((int)tVar6 < (int)tVar5) {
        ptVar3->prev = ptVar4->next;
        ptVar3 = tommy_tree_balance(ptVar3);
        ptVar4->next = ptVar3;
        ptVar4 = tommy_tree_balance(ptVar4);
        root->next = ptVar4;
      }
      ptVar2 = root->next;
      root->next = ptVar2->prev;
      ptVar4 = tommy_tree_balance(root);
      ptVar2->prev = ptVar4;
      root = ptVar2;
    }
    if ((int)(tVar5 - tVar6) < 2) break;
    tVar6 = 0;
    tVar5 = 0;
    if (ptVar4->prev != (tommy_node_struct *)0x0) {
      tVar5 = ptVar4->prev->key;
    }
    ptVar3 = ptVar4->next;
    if (ptVar3 != (tommy_tree_node *)0x0) {
      tVar6 = ptVar3->key;
    }
    if ((int)tVar5 < (int)tVar6) {
      ptVar4->next = ptVar3->prev;
      ptVar4 = tommy_tree_balance(ptVar4);
      ptVar3->prev = ptVar4;
      ptVar4 = tommy_tree_balance(ptVar3);
      root->prev = ptVar4;
    }
    ptVar2 = root->prev;
    root->prev = ptVar2->next;
    ptVar4 = tommy_tree_balance(root);
    ptVar2->next = ptVar4;
    root = ptVar2;
  }
  root->key = 0;
  if (ptVar4 != (tommy_tree_node *)0x0) {
    if (ptVar4->key != 0) {
      root->key = ptVar4->key;
    }
  }
  if ((ptVar3 != (tommy_tree_node *)0x0) && (root->key < ptVar3->key)) {
    root->key = ptVar3->key;
  }
  root->key = root->key + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return root;
  }
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_balance(tommy_tree_node* root)
{
	int delta = tommy_tree_delta(root);

	if (delta < -1) {
		if (tommy_tree_delta(root->next) > 0)
			root->next = tommy_tree_rotate_right(root->next);
		return tommy_tree_rotate_left(root);
	}

	if (delta > 1) {
		if (tommy_tree_delta(root->prev) < 0)
			root->prev = tommy_tree_rotate_left(root->prev);
		return tommy_tree_rotate_right(root);
	}

	/* recompute key */
	root->key = 0;

	if (root->prev && root->prev->key > root->key)
		root->key = root->prev->key;

	if (root->next && root->next->key > root->key)
		root->key = root->next->key;

	/* count itself */
	root->key += 1;

	return root;
}